

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::ensure_builtin(CompilerMSL *this,StorageClass storage,BuiltIn builtin)

{
  bool bVar1;
  long lVar2;
  Bitset *this_00;
  
  if (storage == StorageClassInput) {
    lVar2 = 0xa78;
  }
  else {
    if (storage != StorageClassOutput) {
      return;
    }
    lVar2 = 0xab8;
  }
  this_00 = (Bitset *)
            ((this->super_CompilerGLSL).super_Compiler.ir.ids.stack_storage.aligned_char +
            lVar2 + -0x40);
  bVar1 = Bitset::get(this_00,builtin);
  if (bVar1) {
    return;
  }
  Bitset::set(this_00,builtin);
  Compiler::force_recompile((Compiler *)this);
  return;
}

Assistant:

void CompilerMSL::ensure_builtin(spv::StorageClass storage, spv::BuiltIn builtin)
{
	Bitset *active_builtins = nullptr;
	switch (storage)
	{
	case StorageClassInput:
		active_builtins = &active_input_builtins;
		break;

	case StorageClassOutput:
		active_builtins = &active_output_builtins;
		break;

	default:
		break;
	}

	// At this point, the specified builtin variable must have already been declared in the entry point.
	// If not, mark as active and force recompile.
	if (active_builtins != nullptr && !active_builtins->get(builtin))
	{
		active_builtins->set(builtin);
		force_recompile();
	}
}